

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void av1_post_encode_updates(AV1_COMP *cpi,AV1_COMP_DATA *cpi_data)

{
  int *piVar1;
  FIRSTPASS_INFO *firstpass_info;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  aom_enc_pass aVar5;
  int iVar6;
  AV1_PRIMARY *pAVar7;
  FIRSTPASS_STATS *pFVar8;
  FIRSTPASS_STATS *pFVar9;
  RefCntBuffer *pRVar10;
  RefCntBuffer *pRVar11;
  AV1_PRIMARY *pAVar12;
  double dVar13;
  RefCntBuffer *pRVar14;
  RefCntBuffer *pRVar15;
  RefCntBuffer *pRVar16;
  RefCntBuffer *pRVar17;
  RefCntBuffer *pRVar18;
  int64_t iVar19;
  uchar uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  MV_STATS *pMVar24;
  uint uVar25;
  long lVar26;
  int *piVar27;
  MV_STATS *pMVar28;
  byte bVar29;
  aom_codec_cx_pkt pkt;
  PSNR_STATS psnr;
  aom_codec_cx_pkt local_168;
  undefined1 local_c0 [72];
  size_t sStack_78;
  double local_70;
  double dStack_68;
  double local_60;
  double dStack_58;
  uint64_t local_50;
  uint64_t uStack_48;
  uint64_t local_40;
  uint64_t uStack_38;
  uint32_t local_30 [2];
  uint32_t auStack_28 [2];
  
  bVar29 = 0;
  pAVar7 = cpi->ppi;
  uVar21 = (ulong)cpi->gf_frame_index;
  bVar4 = (pAVar7->gf_group).update_type[uVar21];
  lVar22 = 0x41f04;
  do {
    if (*(char *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar22) != '\0') {
      uVar23 = 1;
      goto LAB_001b8c09;
    }
    lVar22 = lVar22 + 0x24;
  } while (lVar22 != 0x42024);
  uVar23 = 0;
LAB_001b8c09:
  uVar25 = 0;
  if (pAVar7->valid_gm_model_found[bVar4] != 0x7fffffff) {
    uVar25 = pAVar7->valid_gm_model_found[bVar4];
  }
  pAVar7->valid_gm_model_found[bVar4] = uVar25 | uVar23;
  pFVar8 = (cpi->twopass_frame).this_frame;
  if ((pFVar8 != (FIRSTPASS_STATS *)0x0) &&
     (pFVar9 = ((pAVar7->twopass).stats_buf_ctx)->total_left_stats, pFVar9 != (FIRSTPASS_STATS *)0x0
     )) {
    dVar13 = pFVar8->weight;
    pFVar9->frame = pFVar9->frame - pFVar8->frame;
    pFVar9->weight = pFVar9->weight - dVar13;
    dVar13 = pFVar8->frame_avg_wavelet_energy;
    pFVar9->intra_error = pFVar9->intra_error - pFVar8->intra_error;
    pFVar9->frame_avg_wavelet_energy = pFVar9->frame_avg_wavelet_energy - dVar13;
    dVar13 = pFVar8->sr_coded_error;
    pFVar9->coded_error = pFVar9->coded_error - pFVar8->coded_error;
    pFVar9->sr_coded_error = pFVar9->sr_coded_error - dVar13;
    dVar13 = pFVar8->pcnt_motion;
    pFVar9->pcnt_inter = pFVar9->pcnt_inter - pFVar8->pcnt_inter;
    pFVar9->pcnt_motion = pFVar9->pcnt_motion - dVar13;
    dVar13 = pFVar8->pcnt_neutral;
    pFVar9->pcnt_second_ref = pFVar9->pcnt_second_ref - pFVar8->pcnt_second_ref;
    pFVar9->pcnt_neutral = pFVar9->pcnt_neutral - dVar13;
    dVar13 = pFVar8->inactive_zone_rows;
    pFVar9->intra_skip_pct = pFVar9->intra_skip_pct - pFVar8->intra_skip_pct;
    pFVar9->inactive_zone_rows = pFVar9->inactive_zone_rows - dVar13;
    dVar13 = pFVar8->MVr;
    pFVar9->inactive_zone_cols = pFVar9->inactive_zone_cols - pFVar8->inactive_zone_cols;
    pFVar9->MVr = pFVar9->MVr - dVar13;
    dVar13 = pFVar8->MVc;
    pFVar9->mvr_abs = pFVar9->mvr_abs - pFVar8->mvr_abs;
    pFVar9->MVc = pFVar9->MVc - dVar13;
    dVar13 = pFVar8->MVrv;
    pFVar9->mvc_abs = pFVar9->mvc_abs - pFVar8->mvc_abs;
    pFVar9->MVrv = pFVar9->MVrv - dVar13;
    dVar13 = pFVar8->mv_in_out_count;
    pFVar9->MVcv = pFVar9->MVcv - pFVar8->MVcv;
    pFVar9->mv_in_out_count = pFVar9->mv_in_out_count - dVar13;
    pFVar9->count = pFVar9->count - pFVar8->count;
    dVar13 = pFVar8->duration;
    pFVar9->new_mv_count = pFVar9->new_mv_count - pFVar8->new_mv_count;
    pFVar9->duration = pFVar9->duration - dVar13;
  }
  aVar5 = (cpi->oxcf).pass;
  if (((aVar5 != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) &&
     (cpi->is_dropped_frame == false)) {
    if ((((pAVar7->gf_group).frame_parallel_level[uVar21] == 2) &&
        ((pAVar7->gf_group).frame_parallel_level[uVar21 - 1] == 1)) &&
       ((pAVar7->gf_group).update_type[uVar21 - 1] == '\x06')) {
      pRVar10 = pAVar7->ref_frame_map_copy[0];
      pRVar11 = pAVar7->ref_frame_map_copy[1];
      pRVar14 = pAVar7->ref_frame_map_copy[2];
      pRVar15 = pAVar7->ref_frame_map_copy[3];
      pRVar16 = pAVar7->ref_frame_map_copy[4];
      pRVar17 = pAVar7->ref_frame_map_copy[5];
      pRVar18 = pAVar7->ref_frame_map_copy[7];
      (cpi->common).ref_frame_map[6] = pAVar7->ref_frame_map_copy[6];
      (cpi->common).ref_frame_map[7] = pRVar18;
      (cpi->common).ref_frame_map[4] = pRVar16;
      (cpi->common).ref_frame_map[5] = pRVar17;
      (cpi->common).ref_frame_map[2] = pRVar14;
      (cpi->common).ref_frame_map[3] = pRVar15;
      (cpi->common).ref_frame_map[0] = pRVar10;
      (cpi->common).ref_frame_map[1] = pRVar11;
    }
    lVar22 = 8;
    if (((aVar5 == AOM_RC_ONE_PASS) && (pAVar7->lap_enabled == 0)) &&
       (((cpi->oxcf).mode == '\x01' &&
        (((((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (pAVar7->number_spatial_layers == 1)) &&
          (pAVar7->number_temporal_layers == 1)) &&
         (((pAVar7->rtc_ref).set_ref_frame_config == 0 &&
          ((((cpi->common).seq_params)->order_hint_info).enable_order_hint == 0)))))))) {
      lVar22 = (ulong)(cpi->rt_reduce_num_ref_buffers == 0) + 7;
    }
    uVar23 = (cpi->common).current_frame.refresh_frame_flags;
    lVar26 = 0;
    do {
      if ((uVar23 >> ((uint)lVar26 & 0x1f) & 1) != 0) {
        pRVar10 = (cpi->common).cur_frame;
        pRVar11 = (cpi->common).ref_frame_map[lVar26];
        if (pRVar11 != (RefCntBuffer *)0x0) {
          pRVar11->ref_count = pRVar11->ref_count + -1;
        }
        (cpi->common).ref_frame_map[lVar26] = pRVar10;
        pRVar10->ref_count = pRVar10->ref_count + 1;
      }
      lVar26 = lVar26 + 1;
    } while (lVar22 != lVar26);
    if (((pAVar7->gf_group).frame_parallel_level[uVar21] == 1) &&
       ((pAVar7->gf_group).update_type[uVar21] == '\x06')) {
      pRVar10 = (cpi->common).ref_frame_map[0];
      pRVar11 = (cpi->common).ref_frame_map[1];
      pRVar14 = (cpi->common).ref_frame_map[2];
      pRVar15 = (cpi->common).ref_frame_map[3];
      pRVar16 = (cpi->common).ref_frame_map[4];
      pRVar17 = (cpi->common).ref_frame_map[5];
      pRVar18 = (cpi->common).ref_frame_map[7];
      pAVar7->ref_frame_map_copy[6] = (cpi->common).ref_frame_map[6];
      pAVar7->ref_frame_map_copy[7] = pRVar18;
      pAVar7->ref_frame_map_copy[4] = pRVar16;
      pAVar7->ref_frame_map_copy[5] = pRVar17;
      pAVar7->ref_frame_map_copy[2] = pRVar14;
      pAVar7->ref_frame_map_copy[3] = pRVar15;
      pAVar7->ref_frame_map_copy[0] = pRVar10;
      pAVar7->ref_frame_map_copy[1] = pRVar11;
    }
    av1_rc_postencode_update(cpi,cpi_data->frame_size);
  }
  if (cpi_data->pop_lookahead == 1) {
    av1_lookahead_pop(cpi->ppi->lookahead,cpi_data->flush,cpi->compressor_stage);
  }
  if ((cpi->common).show_frame != 0) {
    pAVar12 = cpi->ppi;
    iVar19 = cpi_data->ts_frame_end;
    pAVar12->ts_start_last_show_frame = cpi_data->ts_frame_start;
    pAVar12->ts_end_last_show_frame = iVar19;
  }
  if ((((pAVar7->level_params).keep_level_stats != 0) && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) &&
     (cpi->compressor_stage != '\x01')) {
    if (((cpi->common).current_frame.frame_type == '\0') &&
       ((pAVar7->gf_group).refbuf_state[cpi->gf_frame_index] == '\0')) {
      av1_init_level_info(cpi);
    }
    av1_update_level_info(cpi,cpi_data->frame_size,cpi_data->ts_frame_start,cpi_data->ts_frame_end);
  }
  aVar5 = (cpi->oxcf).pass;
  if ((aVar5 == AOM_RC_FIRST_PASS) || (cpi->compressor_stage == '\x01')) goto LAB_001b91c5;
  if ((aVar5 != AOM_RC_ONE_PASS) || (cpi->ppi->lap_enabled != 0)) {
    av1_twopass_postencode_update(cpi);
  }
  pAVar12 = cpi->ppi;
  uVar21 = (ulong)(uint)(pAVar12->gf_group).layer_depth[cpi->gf_frame_index];
  lVar22 = 7;
  if (uVar21 < 8) {
    lVar22 = *(long *)(&DAT_004db530 + uVar21 * 8);
  }
  piVar1 = pAVar7->fb_of_context_type;
  bVar4 = (cpi->common).current_frame.frame_type;
  if ((((bVar4 & 0xfd) == 0) || ((cpi->common).features.error_resilient_mode != false)) ||
     ((cpi->ext_flags).use_primary_ref_none == true)) {
    pAVar7->fb_of_context_type[4] = -1;
    pAVar7->fb_of_context_type[5] = -1;
    pAVar7->fb_of_context_type[6] = -1;
    pAVar7->fb_of_context_type[7] = -1;
    *piVar1 = -1;
    pAVar7->fb_of_context_type[1] = -1;
    pAVar7->fb_of_context_type[2] = -1;
    pAVar7->fb_of_context_type[3] = -1;
    piVar27 = (cpi->common).remapped_ref_idx + 3;
    if ((cpi->common).show_frame == 0) {
      piVar27 = (cpi->common).remapped_ref_idx + 6;
    }
    piVar1[lVar22] = *piVar27;
  }
  if (((cpi->common).show_existing_frame == 0) ||
     ((bVar4 != 0 && ((cpi->common).features.error_resilient_mode != false)))) {
    if (bVar4 == 0) {
      uVar23 = 0;
LAB_001b903b:
      piVar1[lVar22] = uVar23;
    }
    else {
      uVar23 = 0;
      do {
        if (((uint)(cpi->common).current_frame.refresh_frame_flags >> (uVar23 & 0x1f) & 1) != 0)
        goto LAB_001b903b;
        uVar23 = uVar23 + 1;
      } while (uVar23 != 8);
    }
  }
  if (((cpi->common).show_frame != 0) && ((cpi->rc).frames_to_key != 0)) {
    firstpass_info = &(pAVar12->twopass).firstpass_info;
    if ((pAVar12->twopass).firstpass_info.past_stats_count < 2) {
      av1_firstpass_info_move_cur_index(firstpass_info);
    }
    else {
      av1_firstpass_info_move_cur_index_and_pop(firstpass_info);
    }
    if ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1) {
      uVar2 = (cpi->rc).frames_to_key;
      uVar3 = (cpi->rc).frames_since_key;
      (cpi->rc).frames_to_key = uVar2 + -1;
      (cpi->rc).frames_since_key = uVar3 + 1;
      piVar1 = &(cpi->rc).frames_to_fwd_kf;
      *piVar1 = *piVar1 + -1;
      piVar1 = &(cpi->rc).frames_since_scene_change;
      *piVar1 = *piVar1 + 1;
    }
  }
  if ((cpi->common).show_frame == 0) {
    if ((cpi->ppi->rtc_ref).set_ref_frame_config == 0) {
      uVar23 = 0;
      if (((((cpi->ext_flags).refresh_frame.update_pending == true) &&
           ((cpi->ext_flags).refresh_frame.alt_ref_frame == false)) &&
          ((cpi->ext_flags).refresh_frame.alt2_ref_frame == false)) &&
         (((cpi->ext_flags).refresh_frame.bwd_ref_frame == false &&
          ((cpi->ext_flags).refresh_frame.golden_frame == false)))) {
        uVar23 = (cpi->ext_flags).refresh_frame.last_frame ^ 1;
      }
    }
    else {
      uVar23 = (cpi->ppi->rtc_ref).non_reference_frame;
    }
    if (uVar23 != 0) goto LAB_001b90fa;
  }
  else {
LAB_001b90fa:
    iVar6 = (cpi->rc).frames_till_gf_update_due;
    if (0 < iVar6) {
      (cpi->rc).frames_till_gf_update_due = iVar6 + -1;
    }
  }
  if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
     (((cpi->oxcf).mode == '\x01' &&
      (((cpi->oxcf).gf_cfg.lag_in_frames == 0 &&
       ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1)))))) {
    uVar20 = cpi->gf_frame_index + '\x01';
    if (uVar20 == 0xfa) {
      uVar20 = '\0';
    }
  }
  else {
    uVar20 = cpi->gf_frame_index + '\x01';
  }
  cpi->gf_frame_index = uVar20;
  if ((cpi->do_frame_data_update == true) && ((cpi->common).show_existing_frame == 0)) {
    pAVar12 = cpi->ppi;
    pAVar12->filter_level[0] = (cpi->common).lf.backup_filter_level[0];
    pAVar12->filter_level[1] = (cpi->common).lf.backup_filter_level[1];
    iVar6 = (cpi->common).lf.backup_filter_level_v;
    pAVar12->filter_level_u = (cpi->common).lf.backup_filter_level_u;
    pAVar12->filter_level_v = iVar6;
  }
  pAVar12 = cpi->ppi;
  pMVar24 = &cpi->mv_stats;
  pMVar28 = &pAVar12->mv_stats;
  for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
    iVar6 = pMVar24->q;
    pMVar28->high_prec = pMVar24->high_prec;
    pMVar28->q = iVar6;
    pMVar24 = (MV_STATS *)((long)pMVar24 + (ulong)bVar29 * -0x10 + 8);
    pMVar28 = (MV_STATS *)((long)pMVar28 + ((ulong)bVar29 * -2 + 1) * 8);
  }
  (pAVar12->mv_stats).valid = (cpi->mv_stats).valid;
LAB_001b91c5:
  if (((pAVar7->rtc_ref).set_ref_frame_config != 0) && (cpi->is_dropped_frame == false)) {
    av1_svc_update_buffer_slot_refreshed(cpi);
    av1_svc_set_reference_was_previous(cpi);
  }
  if (pAVar7->use_svc != 0) {
    av1_save_layer_context(cpi);
  }
  if (((pAVar7->b_calculate_psnr != 0) && (cpi_data->frame_size != 0)) &&
     (((cpi->common).show_existing_frame != 0 ||
      ((((cpi->oxcf).pass != AOM_RC_FIRST_PASS && (cpi->compressor_stage != '\x01')) &&
       ((cpi->common).show_frame != 0)))))) {
    uVar23 = (cpi->oxcf).input_cfg.input_bit_depth;
    uVar25 = (cpi->td).mb.e_mbd.bd;
    aom_calc_highbd_psnr
              (cpi->source,&((cpi->common).cur_frame)->buf,(PSNR_STATS *)local_c0,uVar25,uVar23);
    local_168.data.frame.buf = (void *)local_c0._64_8_;
    local_168.data.frame.sz = sStack_78;
    local_168.data.frame.pts = local_c0._32_8_;
    local_168.data.frame.duration = local_c0._40_8_;
    local_168.data.psnr.sse[2] = local_c0._48_8_;
    local_168.data.frame.vis_frame_size = local_c0._56_8_;
    local_168.data.psnr.psnr[2] = (double)local_c0._16_8_;
    local_168.data.psnr.psnr[3] = (double)local_c0._24_8_;
    local_168.data.psnr.psnr[0] = (double)local_c0._0_8_;
    local_168.data.psnr.psnr[1] = (double)local_c0._8_8_;
    if ((uVar23 < uVar25) && ((cpi->source->flags & 8U) != 0)) {
      local_168.data.psnr.samples_hbd[0] = local_30[0];
      local_168.data.psnr.samples_hbd[1] = local_30[1];
      local_168.data.psnr.samples_hbd[2] = auStack_28[0];
      local_168.data.psnr.samples_hbd[3] = auStack_28[1];
      local_168.data.psnr.sse_hbd[0] = local_50;
      local_168.data.psnr.sse_hbd[1] = uStack_48;
      local_168.data.psnr.sse_hbd[2] = local_40;
      local_168.data.psnr.sse_hbd[3] = uStack_38;
      local_168.data.psnr.psnr_hbd[0] = local_70;
      local_168.data.psnr.psnr_hbd[1] = dStack_68;
      local_168.data.psnr.psnr_hbd[2] = local_60;
      local_168.data.psnr.psnr_hbd[3] = dStack_58;
    }
    local_168.kind = AOM_CODEC_PSNR_PKT;
    aom_codec_pkt_list_add(cpi->ppi->output_pkt_list,&local_168);
  }
  return;
}

Assistant:

void av1_post_encode_updates(AV1_COMP *const cpi,
                             const AV1_COMP_DATA *const cpi_data) {
  AV1_PRIMARY *const ppi = cpi->ppi;
  AV1_COMMON *const cm = &cpi->common;

  update_gm_stats(cpi);

#if !CONFIG_REALTIME_ONLY
  // Update the total stats remaining structure.
  if (cpi->twopass_frame.this_frame != NULL &&
      ppi->twopass.stats_buf_ctx->total_left_stats) {
    subtract_stats(ppi->twopass.stats_buf_ctx->total_left_stats,
                   cpi->twopass_frame.this_frame);
  }
#endif

#if CONFIG_OUTPUT_FRAME_SIZE
  FILE *f = fopen("frame_sizes.csv", "a");
  fprintf(f, "%d,", 8 * (int)cpi_data->frame_size);
  fprintf(f, "%d\n", cm->quant_params.base_qindex);
  fclose(f);
#endif  // CONFIG_OUTPUT_FRAME_SIZE

  if (!is_stat_generation_stage(cpi) && !cpi->is_dropped_frame) {
    // Before calling refresh_reference_frames(), copy ppi->ref_frame_map_copy
    // to cm->ref_frame_map for frame_parallel_level 2 frame in a parallel
    // encode set of lower layer frames.
    // TODO(Remya): Move ref_frame_map from AV1_COMMON to AV1_PRIMARY to avoid
    // copy.
    if (ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] == 2 &&
        ppi->gf_group.frame_parallel_level[cpi->gf_frame_index - 1] == 1 &&
        ppi->gf_group.update_type[cpi->gf_frame_index - 1] ==
            INTNL_ARF_UPDATE) {
      memcpy(cm->ref_frame_map, ppi->ref_frame_map_copy,
             sizeof(cm->ref_frame_map));
    }
    refresh_reference_frames(cpi);
    // For frame_parallel_level 1 frame in a parallel encode set of lower layer
    // frames, store the updated cm->ref_frame_map in ppi->ref_frame_map_copy.
    if (ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] == 1 &&
        ppi->gf_group.update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE) {
      memcpy(ppi->ref_frame_map_copy, cm->ref_frame_map,
             sizeof(cm->ref_frame_map));
    }
    av1_rc_postencode_update(cpi, cpi_data->frame_size);
  }

  if (cpi_data->pop_lookahead == 1) {
    av1_lookahead_pop(cpi->ppi->lookahead, cpi_data->flush,
                      cpi->compressor_stage);
  }
  if (cpi->common.show_frame) {
    cpi->ppi->ts_start_last_show_frame = cpi_data->ts_frame_start;
    cpi->ppi->ts_end_last_show_frame = cpi_data->ts_frame_end;
  }
  if (ppi->level_params.keep_level_stats && !is_stat_generation_stage(cpi)) {
    // Initialize level info. at the beginning of each sequence.
    if (cm->current_frame.frame_type == KEY_FRAME &&
        ppi->gf_group.refbuf_state[cpi->gf_frame_index] == REFBUF_RESET) {
      av1_init_level_info(cpi);
    }
    av1_update_level_info(cpi, cpi_data->frame_size, cpi_data->ts_frame_start,
                          cpi_data->ts_frame_end);
  }

  if (!is_stat_generation_stage(cpi)) {
#if !CONFIG_REALTIME_ONLY
    if (!has_no_stats_stage(cpi)) av1_twopass_postencode_update(cpi);
#endif
    update_fb_of_context_type(cpi, ppi->fb_of_context_type);
    update_rc_counts(cpi);
    update_end_of_frame_stats(cpi);
  }

#if CONFIG_THREE_PASS
  if (cpi->oxcf.pass == AOM_RC_THIRD_PASS && cpi->third_pass_ctx) {
    av1_pop_third_pass_info(cpi->third_pass_ctx);
  }
#endif

  if (ppi->rtc_ref.set_ref_frame_config && !cpi->is_dropped_frame) {
    av1_svc_update_buffer_slot_refreshed(cpi);
    av1_svc_set_reference_was_previous(cpi);
  }

  if (ppi->use_svc) av1_save_layer_context(cpi);

  // Note *size = 0 indicates a dropped frame for which psnr is not calculated
  if (ppi->b_calculate_psnr && cpi_data->frame_size > 0) {
    if (cm->show_existing_frame ||
        (!is_stat_generation_stage(cpi) && cm->show_frame)) {
      generate_psnr_packet(cpi);
    }
  }

#if CONFIG_INTERNAL_STATS
  if (!is_stat_generation_stage(cpi)) {
    compute_internal_stats(cpi, (int)cpi_data->frame_size);
  }
#endif  // CONFIG_INTERNAL_STATS

#if CONFIG_THREE_PASS
  // Write frame info. Subtract 1 from frame index since if was incremented in
  // update_rc_counts.
  av1_write_second_pass_per_frame_info(cpi, cpi->gf_frame_index - 1);
#endif
}